

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

void __thiscall Fossilize::VulkanDevice::init_null_device(VulkanDevice *this)

{
  fwrite("Fossilize INFO: Creating null device.\n",0x26,1,_stderr);
  fflush(_stderr);
  this->device = (VkDevice)0x1;
  this->gpu = (VkPhysicalDevice)0x2;
  this->api_version = 0x401000;
  vkCreateSampler = create_sampler;
  vkDestroySampler = destroy_sampler;
  vkCreateDescriptorSetLayout = create_set_layout;
  vkDestroyDescriptorSetLayout = destroy_set_layout;
  vkCreatePipelineLayout = create_pipeline_layout;
  vkDestroyPipelineLayout = destroy_pipeline_layout;
  vkCreateRenderPass = create_render_pass;
  vkCreateRenderPass2 = create_render_pass2;
  vkCreateRenderPass2KHR = create_render_pass2;
  vkDestroyRenderPass = destroy_render_pass;
  vkCreateShaderModule = create_shader_module;
  vkDestroyShaderModule = destroy_shader_module;
  vkCreateGraphicsPipelines = create_graphics_pipelines;
  vkCreateComputePipelines = create_compute_pipelines;
  vkDestroyPipeline = destroy_pipeline;
  vkCreatePipelineCache = create_pipeline_cache;
  vkDestroyPipelineCache = destroy_pipeline_cache;
  vkGetPipelineCacheData = get_pipeline_cache_data;
  vkGetPhysicalDeviceProperties = get_physical_device_properties;
  vkCreateRayTracingPipelinesKHR = create_raytracing_pipelines_khr;
  vkCreateSamplerYcbcrConversionKHR = create_sampler_ycbcr_conversion_khr;
  vkDestroySamplerYcbcrConversionKHR = destroy_sampler_ycbcr_conversion_khr;
  this->is_null_device = true;
  FeatureFilter::init_null_device(&this->feature_filter);
  return;
}

Assistant:

void VulkanDevice::init_null_device()
{
	LOGI("Creating null device.\n");
	device = reinterpret_cast<VkDevice>(uintptr_t(1));
	gpu = reinterpret_cast<VkPhysicalDevice>(uintptr_t(2));
	api_version = VK_API_VERSION_1_1;

	vkCreateSampler = create_sampler;
	vkDestroySampler = destroy_sampler;
	vkCreateDescriptorSetLayout = create_set_layout;
	vkDestroyDescriptorSetLayout = destroy_set_layout;
	vkCreatePipelineLayout = create_pipeline_layout;
	vkDestroyPipelineLayout = destroy_pipeline_layout;
	vkCreateRenderPass = create_render_pass;
	vkCreateRenderPass2 = create_render_pass2;
	vkCreateRenderPass2KHR = create_render_pass2;
	vkDestroyRenderPass = destroy_render_pass;
	vkCreateShaderModule = create_shader_module;
	vkDestroyShaderModule = destroy_shader_module;
	vkCreateGraphicsPipelines = create_graphics_pipelines;
	vkCreateComputePipelines = create_compute_pipelines;
	vkDestroyPipeline = destroy_pipeline;
	vkCreatePipelineCache = create_pipeline_cache;
	vkDestroyPipelineCache = destroy_pipeline_cache;
	vkGetPipelineCacheData = get_pipeline_cache_data;
	vkGetPhysicalDeviceProperties = get_physical_device_properties;
	vkCreateRayTracingPipelinesKHR = create_raytracing_pipelines_khr;
	vkCreateSamplerYcbcrConversionKHR = create_sampler_ycbcr_conversion_khr;
	vkDestroySamplerYcbcrConversionKHR = destroy_sampler_ycbcr_conversion_khr;
	is_null_device = true;

	feature_filter.init_null_device();
}